

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O0

void byte_swap(char *data,int size)

{
  char cVar1;
  char tmp;
  int i;
  int size_local;
  char *data_local;
  
  for (i = 0; i < size / 2; i = i + 1) {
    cVar1 = data[i];
    data[i] = data[(size - i) + -1];
    data[(size - i) + -1] = cVar1;
  }
  return;
}

Assistant:

static void
byte_swap(char *data, int size)
{
    int i;
    assert((size % 2) == 0);
    for (i = 0; i < size / 2; i++) {
	char tmp = data[i];
	data[i] = data[size - i - 1];
	data[size - i - 1] = tmp;
    }
}